

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpc_analyzer.cc
# Opt level: O2

float __thiscall sptk::reaper::LpcAnalyzer::WindowedRms(LpcAnalyzer *this,float *data,int size)

{
  ulong uVar1;
  ulong uVar2;
  float fVar3;
  float fVar4;
  
  GetWindow(this,size);
  uVar1 = 0;
  uVar2 = 0;
  if (0 < size) {
    uVar2 = (ulong)(uint)size;
  }
  fVar3 = 0.0;
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    fVar4 = (this->energywind_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[uVar1] * data[uVar1];
    fVar3 = fVar3 + fVar4 * fVar4;
  }
  fVar3 = fVar3 / (float)size;
  if (0.0 <= fVar3) {
    return SQRT(fVar3);
  }
  fVar3 = sqrtf(fVar3);
  return fVar3;
}

Assistant:

float LpcAnalyzer::WindowedRms(float* data, int size) {
  float sum, f;
  int i;

  GetWindow(size);
  for (i = 0, sum = 0.0; i < size; i++) {
    f = energywind_[i] * (*data++);
    sum += f * f;
  }
  return sqrt(sum / size);
}